

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

QRect __thiscall QEvdevTouchScreenData::screenGeometry(QEvdevTouchScreenData *this)

{
  QPointer<QScreen> *this_00;
  QObject *ptr;
  Data *pDVar1;
  undefined8 uVar2;
  bool bVar3;
  QWindow *context;
  QObject *context_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QArrayDataPointer<char16_t> local_70;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_forceToActiveWindow == true) {
    context = (QWindow *)QGuiApplication::focusWindow();
    if (context == (QWindow *)0x0) {
LAB_0010b34c:
      uVar4 = 0xffffffff;
      QVar7 = (QRect)(ZEXT816(0xffffffff00000000) << 0x40);
      goto LAB_0010b351;
    }
    local_58 = QWindow::geometry();
    QVar7 = QHighDpi::toNativeWindowGeometry<QRect,QWindow>((QRect *)local_58,context);
  }
  else {
    context_00 = (QObject *)QGuiApplication::primaryScreen();
    if ((this->m_screenName).d.size != 0) {
      this_00 = &this->m_screen;
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      if (!bVar3) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QGuiApplication::screens();
        uVar2 = local_58._8_8_;
        lVar5 = (long)local_48 << 3;
        lVar6 = 0;
        do {
          if (lVar5 == lVar6) goto LAB_0010b2d6;
          ptr = *(QObject **)(uVar2 + lVar6);
          QScreen::name();
          bVar3 = comparesEqual((QString *)&local_70,&this->m_screenName);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          lVar6 = lVar6 + 8;
        } while (!bVar3);
        QWeakPointer<QObject>::assign<QObject>(&this_00->wp,ptr);
LAB_0010b2d6:
        QArrayDataPointer<QScreen_*>::~QArrayDataPointer((QArrayDataPointer<QScreen_*> *)local_58);
      }
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      if (bVar3) {
        pDVar1 = (this_00->wp).d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) goto LAB_0010b34c;
        context_00 = (this->m_screen).wp.value;
      }
    }
    if (context_00 == (QObject *)0x0) goto LAB_0010b34c;
    local_58 = QScreen::geometry();
    QVar7 = QHighDpi::toNativePixels<QRect,QScreen>((QRect *)local_58,(QScreen *)context_00);
  }
  uVar4 = QVar7._8_8_;
LAB_0010b351:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  uVar4 = uVar4 & 0xffffffff | QVar7._8_8_ & 0xffffffff00000000;
  QVar7.x2.m_i = (int)uVar4;
  QVar7.y2.m_i = (int)(uVar4 >> 0x20);
  return QVar7;
}

Assistant:

QRect QEvdevTouchScreenData::screenGeometry() const
{
    if (m_forceToActiveWindow) {
        QWindow *win = QGuiApplication::focusWindow();
        return win ? QHighDpi::toNativeWindowGeometry(win->geometry(), win) : QRect();
    }

    // Now it becomes tricky. Traditionally we picked the primaryScreen()
    // and were done with it. But then, enter multiple screens, and
    // suddenly it was all broken.
    //
    // For now we only support the display configuration of the KMS/DRM
    // backends of eglfs. See QOutputMapping.
    //
    // The good news it that once winRect refers to the correct screen
    // geometry in the full virtual desktop space, there is nothing else
    // left to do since qguiapp will handle the rest.
    QScreen *screen = QGuiApplication::primaryScreen();
    if (!m_screenName.isEmpty()) {
        if (!m_screen) {
            const QList<QScreen *> screens = QGuiApplication::screens();
            for (QScreen *s : screens) {
                if (s->name() == m_screenName) {
                    m_screen = s;
                    break;
                }
            }
        }
        if (m_screen)
            screen = m_screen;
    }
    return screen ? QHighDpi::toNativePixels(screen->geometry(), screen) : QRect();
}